

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O2

String * __thiscall
kj::
str<char_const(&)[58],kj::StringPtr,char_const(&)[39],kj::StringPtr,char_const(&)[36],kj::StringPtr,char_const(&)[57],kj::StringPtr,char_const(&)[70]>
          (String *__return_storage_ptr__,kj *this,char (*params) [58],StringPtr *params_1,
          char (*params_2) [39],StringPtr *params_3,char (*params_4) [36],StringPtr *params_5,
          char (*params_6) [57],StringPtr *params_7,char (*params_8) [70])

{
  ArrayPtr<const_char> local_c0;
  ArrayPtr<const_char> local_b0;
  ArrayPtr<const_char> local_a0;
  ArrayPtr<const_char> local_90;
  ArrayPtr<const_char> local_80;
  ArrayPtr<const_char> local_70;
  ArrayPtr<const_char> local_60;
  ArrayPtr<const_char> local_50;
  ArrayPtr<const_char> local_40;
  
  local_a0 = toCharSequence<char_const(&)[58]>((char (*) [58])this);
  local_b0.ptr = *(char **)*params;
  local_b0.size_ = *(long *)(*params + 8) - 1;
  local_c0 = toCharSequence<char_const(&)[39]>((char (*) [39])params_1);
  local_40.ptr = *(char **)*params_2;
  local_40.size_ = *(long *)(*params_2 + 8) - 1;
  local_50 = toCharSequence<char_const(&)[36]>((char (*) [36])params_3);
  local_60.ptr = *(char **)*params_4;
  local_60.size_ = *(long *)(*params_4 + 8) - 1;
  local_70 = toCharSequence<char_const(&)[57]>((char (*) [57])params_5);
  local_80.ptr = *(char **)*params_6;
  local_80.size_ = *(long *)(*params_6 + 8) - 1;
  local_90 = toCharSequence<char_const(&)[70]>((char (*) [70])params_7);
  _::
  concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,(_ *)&local_a0,&local_b0,&local_c0,&local_40,&local_50,&local_60
             ,&local_70,&local_80,&local_90,(ArrayPtr<const_char> *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}